

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  TestResult *pTVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  TestResult *in_RDI;
  int i;
  string kTestsuites;
  int in_stack_fffffffffffffc0c;
  UnitTest *in_stack_fffffffffffffc10;
  int *in_stack_fffffffffffffc38;
  TestResult *result;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  string *in_stack_fffffffffffffcf0;
  TestResult *name;
  string *in_stack_fffffffffffffcf8;
  string *element_name;
  undefined4 in_stack_fffffffffffffd00;
  int local_2d8;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  string local_288 [36];
  int local_264;
  string local_260 [8];
  TimeInMillis in_stack_fffffffffffffda8;
  allocator local_239;
  string local_238 [32];
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [8];
  TimeInMillis in_stack_fffffffffffffe38;
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [36];
  int local_134;
  string local_130 [39];
  allocator local_109;
  string local_108 [36];
  int local_e4;
  string local_e0 [24];
  TestCase *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  string local_b8 [36];
  int local_94;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [40];
  TestResult *local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuites",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::operator<<((ostream *)local_8,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar4 = std::operator<<((ostream *)local_8,"<");
  std::operator<<(poVar4,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"tests",&local_69);
  iVar2 = UnitTest::reportable_test_count((UnitTest *)0x151e92);
  local_94 = iVar2;
  StreamableToString<int>(in_stack_fffffffffffffc38);
  OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),in_stack_fffffffffffffcf8,
                     in_stack_fffffffffffffcf0,
                     (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  element_name = (string *)&stack0xffffffffffffff47;
  name = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"failures",(allocator *)element_name);
  iVar3 = UnitTest::failed_test_count((UnitTest *)0x151f5e);
  local_e4 = iVar3;
  StreamableToString<int>(in_stack_fffffffffffffc38);
  OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),element_name,
                     (string *)name,(string *)CONCAT44(iVar3,in_stack_fffffffffffffce8));
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  result = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"disabled",&local_109);
  local_134 = UnitTest::reportable_disabled_test_count((UnitTest *)0x15202a);
  StreamableToString<int>(in_stack_fffffffffffffc38);
  OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),element_name,
                     (string *)name,(string *)CONCAT44(iVar3,in_stack_fffffffffffffce8));
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"errors",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"0",&local_181);
  OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),element_name,
                     (string *)name,(string *)CONCAT44(iVar3,in_stack_fffffffffffffce8));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"timestamp",&local_1a9);
  UnitTest::start_timestamp((UnitTest *)0x1521c7);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffe38);
  OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),element_name,
                     (string *)name,(string *)CONCAT44(iVar3,in_stack_fffffffffffffce8));
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"time",&local_1f1);
  UnitTest::elapsed_time((UnitTest *)0x152286);
  FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffda8);
  OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),element_name,
                     (string *)name,(string *)CONCAT44(iVar3,in_stack_fffffffffffffce8));
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"random_seed",&local_239);
    local_264 = UnitTest::random_seed((UnitTest *)0x152349);
    StreamableToString<int>(in_stack_fffffffffffffc38);
    OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),element_name,
                       (string *)name,(string *)CONCAT44(iVar3,in_stack_fffffffffffffce8));
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
  }
  pTVar1 = local_8;
  UnitTest::ad_hoc_test_result((UnitTest *)0x15271b);
  TestPropertiesAsXmlAttributes_abi_cxx11_(result);
  std::operator<<((ostream *)pTVar1,local_288);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"name",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"AllTests",&local_2d1);
  OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffd00),element_name,
                     (string *)name,(string *)CONCAT44(iVar3,in_stack_fffffffffffffce8));
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::operator<<((ostream *)local_8,">\n");
  local_2d8 = 0;
  while( true ) {
    iVar2 = UnitTest::total_test_case_count((UnitTest *)0x15284f);
    if (iVar2 <= local_2d8) break;
    UnitTest::GetTestCase(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
    iVar2 = TestCase::reportable_test_count((TestCase *)0x15288a);
    if (0 < iVar2) {
      UnitTest::GetTestCase(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
      PrintXmlTestCase(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    local_2d8 = local_2d8 + 1;
  }
  poVar4 = std::operator<<((ostream *)local_8,"</");
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }

  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0)
      PrintXmlTestCase(stream, *unit_test.GetTestCase(i));
  }
  *stream << "</" << kTestsuites << ">\n";
}